

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

Qiniu_Error
Qiniu_Io_PutFile(Qiniu_Client *self,Qiniu_Io_PutRet *ret,char *uptoken,char *key,char *localFile,
                Qiniu_Io_PutExtra *extra)

{
  Qiniu_Bool QVar1;
  Qiniu_Error QVar2;
  char *local_168;
  char *local_130;
  char *bucketName;
  char *accessKey;
  char *localFileName;
  size_t fileSize;
  Qiniu_Io_form form;
  Qiniu_Rd_Reader rdr;
  Qiniu_FileInfo fi;
  Qiniu_Io_PutExtra *extra_local;
  char *localFile_local;
  char *key_local;
  char *uptoken_local;
  Qiniu_Io_PutRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  accessKey = (char *)0x0;
  bucketName = (char *)0x0;
  local_130 = (char *)0x0;
  fi.__glibc_reserved[2] = (__syscall_slong_t)extra;
  QVar1 = Qiniu_Utils_Extract_Bucket(uptoken,&bucketName,&local_130);
  if (QVar1 == 0) {
    self_local = (Qiniu_Client *)0x190;
    err._0_8_ = anon_var_dwarf_8ce2;
    goto LAB_00118190;
  }
  Qiniu_Io_form_init((Qiniu_Io_form *)&fileSize,uptoken,key,
                     (Qiniu_Io_PutExtra **)(fi.__glibc_reserved + 2));
  if (*(long *)(fi.__glibc_reserved[2] + 0x18) == 0) {
    local_168 = "QINIU-C-SDK-UP-FILE";
  }
  else {
    local_168 = *(char **)(fi.__glibc_reserved[2] + 0x18);
  }
  accessKey = local_168;
  if (*(long *)(fi.__glibc_reserved[2] + 0x38) == 0) {
    curl_formadd(&fileSize,&form,1,"file",10,localFile,0x10,local_168,0x11);
LAB_001180d2:
    QVar2 = Qiniu_Io_call(self,bucketName,local_130,ret,(curl_httppost *)fileSize,
                          (Qiniu_Io_PutExtra *)fi.__glibc_reserved[2]);
    err._0_8_ = QVar2.message;
    self_local = (Qiniu_Client *)(ulong)(uint)QVar2.code;
    if ((*(long *)(fi.__glibc_reserved[2] + 0x38) != 0) &&
       (Qiniu_Rd_Reader_Close((Qiniu_Rd_Reader *)&form.lastptr), QVar2.code == 0x2a)) {
      if ((int)rdr.offset == 1) {
        self_local = (Qiniu_Client *)0x2703;
        err._0_8_ = anon_var_dwarf_8d26;
      }
      else if ((int)rdr.offset == 2) {
        self_local = (Qiniu_Client *)0x2702;
        err._0_8_ = anon_var_dwarf_8d3d;
      }
    }
  }
  else {
    memset(&form.lastptr,0,0x28);
    rdr.abortUserData = *(void **)(fi.__glibc_reserved[2] + 0x38);
    rdr._16_8_ = *(undefined8 *)(fi.__glibc_reserved[2] + 0x30);
    QVar2 = Qiniu_Rd_Reader_Open((Qiniu_Rd_Reader *)&form.lastptr,localFile);
    err._0_8_ = QVar2.message;
    self_local = (Qiniu_Client *)(ulong)(uint)QVar2.code;
    if (QVar2.code == 200) {
      memset(&rdr.abortCallback,0,0x90);
      QVar2 = Qiniu_File_Stat((Qiniu_File *)form.lastptr,(Qiniu_FileInfo *)&rdr.abortCallback);
      err._0_8_ = QVar2.message;
      self_local = (Qiniu_Client *)(ulong)(uint)QVar2.code;
      if (QVar2.code == 200) {
        localFileName = (char *)fi.st_rdev;
        curl_formadd(&fileSize,&form,1,"file",0x13,&form.lastptr,6,fi.st_rdev,0x10,accessKey,0x11);
        goto LAB_001180d2;
      }
    }
  }
  Qiniu_Free(bucketName);
  Qiniu_Free(local_130);
LAB_00118190:
  QVar2.message = (char *)err._0_8_;
  QVar2._0_8_ = self_local;
  return QVar2;
}

Assistant:

Qiniu_Error Qiniu_Io_PutFile(
    Qiniu_Client *self, Qiniu_Io_PutRet *ret,
    const char *uptoken, const char *key, const char *localFile, Qiniu_Io_PutExtra *extra)
{
    Qiniu_Error err = Qiniu_OK;
    Qiniu_FileInfo fi;
    Qiniu_Rd_Reader rdr;
    Qiniu_Io_form form;
    size_t fileSize;
    const char *localFileName = NULL, *accessKey = NULL, *bucketName = NULL;

    if (!Qiniu_Utils_Extract_Bucket(uptoken, &accessKey, &bucketName))
    {
        err.code = 400;
        err.message = "parse uptoken failed";
        return err;
    }

    Qiniu_Io_form_init(&form, uptoken, key, &extra);

    // BugFix : If the filename attribute of the file form-data section is not assigned or holds an empty string,
    //          and the real file size is larger than 10MB, then the Go server will return an error like
    //          "multipart: message too large".
    //          Assign an arbitary non-empty string to this attribute will force the Go server to write all the data
    //          into a temporary file and then every thing goes right.
    localFileName = (extra->localFileName) ? extra->localFileName : "QINIU-C-SDK-UP-FILE";

    //// For aborting uploading file.
    if (extra->upAbortCallback)
    {
        Qiniu_Zero(rdr);

        rdr.abortCallback = extra->upAbortCallback;
        rdr.abortUserData = extra->upAbortUserData;

        err = Qiniu_Rd_Reader_Open(&rdr, localFile);
        if (err.code != 200)
        {
            goto error;
        } // if

        Qiniu_Zero(fi);
        err = Qiniu_File_Stat(rdr.file, &fi);
        if (err.code != 200)
        {
            goto error;
        } // if

        fileSize = fi.st_size;

        curl_formadd(&form.formpost, &form.lastptr, CURLFORM_COPYNAME, "file", CURLFORM_STREAM, &rdr,
                     CURLFORM_CONTENTSLENGTH, (long)fileSize, CURLFORM_FILENAME, localFileName, CURLFORM_END);
    }
    else
    {
        curl_formadd(&form.formpost, &form.lastptr, CURLFORM_COPYNAME, "file", CURLFORM_FILE, localFile,
                     CURLFORM_FILENAME, localFileName, CURLFORM_END);
    } // if

    err = Qiniu_Io_call(self, accessKey, bucketName, ret, form.formpost, extra);

    //// For aborting uploading file.
    if (extra->upAbortCallback)
    {
        Qiniu_Rd_Reader_Close(&rdr);
        if (err.code == CURLE_ABORTED_BY_CALLBACK)
        {
            if (rdr.status == QINIU_RD_ABORT_BY_CALLBACK)
            {
                err.code = 9987;
                err.message = "Upload progress has been aborted by caller";
            }
            else if (rdr.status == QINIU_RD_ABORT_BY_READAT)
            {
                err.code = 9986;
                err.message = "Upload progress has been aborted by Qiniu_File_ReadAt()";
            } // if
        }     // if
    }         // if

error:
    Qiniu_Free((void *)accessKey);
    Qiniu_Free((void *)bucketName);
    return err;
}